

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O1

void __thiscall
chrono::ChBezierCurve::ChBezierCurve
          (ChBezierCurve *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points)

{
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_00;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_01;
  ulong n;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pointer pCVar16;
  pointer pCVar17;
  pointer pCVar18;
  long lVar19;
  double *rhs;
  double *x;
  double *x_00;
  double *x_01;
  double *pdVar20;
  pointer pCVar21;
  long lVar22;
  long lVar23;
  ulong __new_size;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&this->m_points,points);
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar22 = (long)(points->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(points->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  lVar19 = lVar22 >> 3;
  __new_size = lVar19 * -0x5555555555555555;
  if (__new_size < 2) {
    __assert_fail("numPoints > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChBezierCurve.cpp"
                  ,0x4c,"chrono::ChBezierCurve::ChBezierCurve(const std::vector<ChVector<>> &)");
  }
  this_00 = &this->m_inCV;
  this_01 = &this->m_outCV;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (this_00,__new_size);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (this_01,__new_size);
  pCVar16 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar21 = (this_00->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar16 != pCVar21) {
    pCVar21->m_data[0] = pCVar16->m_data[0];
    pCVar21->m_data[1] = pCVar16->m_data[1];
    pCVar21->m_data[2] = pCVar16->m_data[2];
  }
  n = __new_size - 1;
  pCVar18 = pCVar16 + n;
  pCVar17 = (this_01->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar16 != pCVar17) {
    pCVar17[n].m_data[0] = pCVar18->m_data[0];
    pCVar17[n].m_data[1] = pCVar18->m_data[1];
    pCVar17[n].m_data[2] = pCVar18->m_data[2];
  }
  if (lVar22 == 0x30) {
    dVar1 = pCVar16->m_data[1];
    dVar2 = pCVar16->m_data[2];
    dVar3 = pCVar16[1].m_data[1];
    dVar4 = pCVar16[1].m_data[2];
    pCVar17->m_data[0] =
         (pCVar16->m_data[0] + pCVar16->m_data[0] + pCVar16[1].m_data[0]) * 0.3333333333333333;
    pCVar17->m_data[1] = (dVar1 + dVar1 + dVar3) * 0.3333333333333333;
    pCVar17->m_data[2] = (dVar2 + dVar2 + dVar4) * 0.3333333333333333;
    dVar1 = pCVar16[1].m_data[2];
    dVar2 = pCVar16->m_data[2];
    dVar3 = pCVar16[1].m_data[1];
    dVar4 = pCVar16->m_data[1];
    pCVar21[1].m_data[0] =
         (pCVar16[1].m_data[0] + pCVar16[1].m_data[0] + pCVar16->m_data[0]) * 0.3333333333333333;
    pCVar21[1].m_data[1] = (dVar3 + dVar3 + dVar4) * 0.3333333333333333;
    pCVar21[1].m_data[2] = (dVar1 + dVar1 + dVar2) * 0.3333333333333333;
    return;
  }
  uVar24 = -(ulong)(n >> 0x3d != 0) | n * 8;
  rhs = (double *)operator_new__(uVar24);
  x = (double *)operator_new__(uVar24);
  x_00 = (double *)operator_new__(uVar24);
  x_01 = (double *)operator_new__(uVar24);
  uVar24 = __new_size - 2;
  if (1 < uVar24) {
    pCVar21 = pCVar16 + 2;
    lVar22 = 0;
    do {
      auVar37._8_8_ = 0;
      auVar37._0_8_ = pCVar21[-1].m_data[0];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = pCVar21->m_data[0] + pCVar21->m_data[0];
      auVar37 = vfmadd231sd_fma(auVar32,ZEXT816(0x4010000000000000),auVar37);
      rhs[lVar22 + 1] = auVar37._0_8_;
      lVar22 = lVar22 + 1;
      pCVar21 = pCVar21 + 1;
    } while (__new_size - 3 != lVar22);
  }
  auVar25._8_8_ = 0;
  auVar25._0_8_ = pCVar16[1].m_data[0];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = pCVar16->m_data[0];
  auVar37 = vfmadd213sd_fma(auVar25,ZEXT816(0x4000000000000000),auVar5);
  *rhs = auVar37._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = pCVar16[uVar24].m_data[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = pCVar18->m_data[0];
  auVar37 = vfmadd213sd_fma(auVar26,ZEXT816(0x4020000000000000),auVar6);
  rhs[lVar19 * 0xaaaaaaaaaaaaaab + -2] = auVar37._0_8_ * 0.5;
  solveTriDiag(n,rhs,x);
  if (1 < uVar24) {
    pdVar20 = (points->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].m_data + 1;
    lVar22 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pdVar20[-3];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *pdVar20 + *pdVar20;
      auVar37 = vfmadd231sd_fma(auVar33,ZEXT816(0x4010000000000000),auVar7);
      rhs[lVar22 + 1] = auVar37._0_8_;
      lVar22 = lVar22 + 1;
      pdVar20 = pdVar20 + 3;
    } while (__new_size - 3 != lVar22);
  }
  pCVar16 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = pCVar16[1].m_data[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = pCVar16->m_data[1];
  auVar37 = vfmadd213sd_fma(auVar27,ZEXT816(0x4000000000000000),auVar8);
  *rhs = auVar37._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = pCVar16[uVar24].m_data[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = pCVar16[n].m_data[1];
  auVar37 = vfmadd213sd_fma(auVar28,ZEXT816(0x4020000000000000),auVar9);
  rhs[lVar19 * 0xaaaaaaaaaaaaaab + -2] = auVar37._0_8_ * 0.5;
  solveTriDiag(n,rhs,x_00);
  if (1 < uVar24) {
    pdVar20 = (points->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].m_data + 2;
    lVar22 = 0;
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = pdVar20[-3];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *pdVar20 + *pdVar20;
      auVar37 = vfmadd231sd_fma(auVar34,ZEXT816(0x4010000000000000),auVar10);
      rhs[lVar22 + 1] = auVar37._0_8_;
      lVar22 = lVar22 + 1;
      pdVar20 = pdVar20 + 3;
    } while (__new_size - 3 != lVar22);
  }
  pCVar16 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = pCVar16[1].m_data[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pCVar16->m_data[2];
  auVar37 = vfmadd213sd_fma(auVar29,ZEXT816(0x4000000000000000),auVar11);
  *rhs = auVar37._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = pCVar16[uVar24].m_data[2];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = pCVar16[n].m_data[2];
  auVar37 = vfmadd213sd_fma(ZEXT816(0x4020000000000000),auVar30,auVar12);
  rhs[lVar19 * 0xaaaaaaaaaaaaaab + -2] = auVar37._0_8_ * 0.5;
  solveTriDiag(n,rhs,x_01);
  auVar37 = ZEXT816(0x4000000000000000);
  if (uVar24 != 0) {
    pCVar16 = (this_01->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pCVar21 = (points->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pCVar18 = (this_00->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar22 = 2;
    lVar23 = 2;
    do {
      dVar1 = x_00[lVar23 + -2];
      dVar2 = x_01[lVar23 + -2];
      pCVar16->m_data[lVar22 + -2] = x[lVar23 + -2];
      pCVar16->m_data[lVar22 + -1] = dVar1;
      pCVar16->m_data[lVar22] = dVar2;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = pCVar21->m_data[lVar22 + 1];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = pCVar21->m_data[lVar22 + 2];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = x[lVar23 + -1];
      auVar32 = vfmsub213sd_fma(auVar31,auVar37,auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = x_00[lVar23 + -1];
      auVar5 = vfmsub213sd_fma(auVar35,auVar37,auVar14);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = pCVar21[1].m_data[lVar22];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = x_01[lVar23 + -1];
      auVar6 = vfmsub213sd_fma(auVar36,auVar37,auVar15);
      pCVar18->m_data[lVar22 + 1] = auVar32._0_8_;
      pCVar18->m_data[lVar22 + 2] = auVar5._0_8_;
      pCVar18[1].m_data[lVar22] = auVar6._0_8_;
      lVar23 = lVar23 + 1;
      lVar22 = lVar22 + 3;
    } while (__new_size - lVar23 != 0);
  }
  dVar1 = x_00[lVar19 * 0xaaaaaaaaaaaaaab + -2];
  dVar2 = x_01[lVar19 * 0xaaaaaaaaaaaaaab + -2];
  pCVar16 = (this_01->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar16[uVar24].m_data[0] = x[lVar19 * 0xaaaaaaaaaaaaaab + -2];
  pCVar16[uVar24].m_data[1] = dVar1;
  pCVar16[uVar24].m_data[2] = dVar2;
  pCVar16 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pCVar16[n].m_data[1];
  dVar2 = x_00[lVar19 * 0xaaaaaaaaaaaaaab + -2];
  dVar3 = pCVar16[n].m_data[2];
  dVar4 = x_01[lVar19 * 0xaaaaaaaaaaaaaab + -2];
  pCVar21 = (this_00->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar21[n].m_data[0] = (pCVar16[n].m_data[0] + x[lVar19 * 0xaaaaaaaaaaaaaab + -2]) * 0.5;
  pCVar21[n].m_data[1] = (dVar1 + dVar2) * 0.5;
  pCVar21[n].m_data[2] = (dVar3 + dVar4) * 0.5;
  operator_delete__(rhs);
  operator_delete__(x);
  operator_delete__(x_00);
  operator_delete__(x_01);
  return;
}

Assistant:

ChBezierCurve::ChBezierCurve(const std::vector<ChVector<> >& points) : m_points(points) {
    size_t numPoints = points.size();
    assert(numPoints > 1);

    m_inCV.resize(numPoints);
    m_outCV.resize(numPoints);

    m_inCV[0] = points[0];
    m_outCV[numPoints - 1] = points[numPoints - 1];

    // Special case for two points only.  In this case, the curve should be a
    // straight line.
    if (numPoints == 2) {
        m_outCV[0] = (2.0 * points[0] + points[1]) / 3.0;
        m_inCV[1] = (points[0] + 2.0 * points[1]) / 3.0;
        return;
    }

    /*
    // Calculate control points
    // Use heuristic approach from http://www.antigrain.com/research/bezier_interpolation/index.html

    //// NOTE: Does not produce a proper Bezier vurve and as such requires a different eval() function!!!

    static const double smooth_value = 0.2;

    // Calculate centers and lengths
    size_t numIntervals = numPoints - 1;
    std::vector<ChVector<>> center(numIntervals);
    std::vector<double> length(numIntervals);
    for (int i = 0; i < numIntervals; i++) {
        center[i] = (points[i] + points[i + 1]) / 2;
        length[i] = (points[i + 1] - points[i]).Length();
    }

    // Calculate control points
    for (size_t i = 0; i < numIntervals; i++) {
        // Interval i: [p(i), p(i+1)] -> set outCV(i) & inCV(i+1)

        double len1 = (i == 0) ? 0 : length[i-1];
        double len2 = length[i];
        double len3 = (i == numIntervals - 1) ? 0 : length[i + 1];

        auto c1 = (i == 0) ? points[0] : center[i - 1];
        auto c2 = center[i];
        auto c3 = (i == numIntervals - 1) ? points[i + 1] : center[i + 1];

        double k1 = len1 / (len1 + len2);
        double k2 = len2 / (len2 + len3);

        auto m1 = c1 + (c2 - c1) * k1;
        auto m2 = c2 + (c2 - c2) * k2;

        m_outCV[i] = m1 + (c2 - m1) * smooth_value + points[i] - m1;
        m_inCV[i + 1] = m2 + (c2 - m2) * smooth_value + points[i + 1] - m2;
    }
    */

    // Calculate coordinates of the outCV control points.
    size_t n = numPoints - 1;
    double* rhs = new double[n];
    double* x = new double[n];
    double* y = new double[n];
    double* z = new double[n];

    // X coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].x() + 2 * points[i + 1].x();
    rhs[0] = points[0].x() + 2 * points[1].x();
    rhs[n - 1] = (8 * points[n - 1].x() + points[n].x()) / 2;
    solveTriDiag(n, rhs, x);

    // Y coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].y() + 2 * points[i + 1].y();
    rhs[0] = points[0].y() + 2 * points[1].y();
    rhs[n - 1] = (8 * points[n - 1].y() + points[n].y()) / 2;
    solveTriDiag(n, rhs, y);

    // Z coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].z() + 2 * points[i + 1].z();
    rhs[0] = points[0].z() + 2 * points[1].z();
    rhs[n - 1] = (8 * points[n - 1].z() + points[n].z()) / 2;
    solveTriDiag(n, rhs, z);

    // Set control points outCV and inCV.
    for (size_t i = 0; i < n - 1; i++) {
        m_outCV[i] = ChVector<>(x[i], y[i], z[i]);
        m_inCV[i + 1] =
            ChVector<>(2 * points[i + 1].x() - x[i + 1], 2 * points[i + 1].y() - y[i + 1], 2 * points[i + 1].z() - z[i + 1]);
    }
    m_outCV[n - 1] = ChVector<>(x[n - 1], y[n - 1], z[n - 1]);
    m_inCV[n] = ChVector<>((points[n].x() + x[n - 1]) / 2, (points[n].y() + y[n - 1]) / 2, (points[n].z() + z[n - 1]) / 2);

    // Cleanup.
    delete[] rhs;
    delete[] x;
    delete[] y;
    delete[] z;
}